

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::NodeTranslator::BrandScope::BrandScope
          (BrandScope *this,ErrorReporter *errorReporter,uint64_t startingScopeId,
          uint startingScopeParamCount,Resolver *startingScope)

{
  NullableValue<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl> *other;
  ResolvedDecl *pRVar1;
  ResolvedDecl *pRVar2;
  ResolvedDecl *pRVar3;
  Own<capnp::compiler::NodeTranslator::BrandScope> local_130;
  Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_> local_120;
  Maybe<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl> local_110;
  undefined1 local_a8 [8];
  NullableValue<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl> p;
  Resolver *startingScope_local;
  uint startingScopeParamCount_local;
  uint64_t startingScopeId_local;
  ErrorReporter *errorReporter_local;
  BrandScope *this_local;
  
  kj::Refcounted::Refcounted(&this->super_Refcounted);
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_00cdb230;
  this->errorReporter = errorReporter;
  kj::Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_>::Maybe(&this->parent,(void *)0x0)
  ;
  this->leafId = startingScopeId;
  this->leafParamCount = startingScopeParamCount;
  this->inherited = true;
  kj::Array<capnp::compiler::NodeTranslator::BrandedDecl>::Array(&this->params);
  (*startingScope->_vptr_Resolver[4])(&local_110);
  other = kj::_::readMaybe<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>(&local_110);
  kj::_::NullableValue<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>::NullableValue
            ((NullableValue<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl> *)local_a8,
             other);
  kj::Maybe<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>::~Maybe(&local_110);
  pRVar1 = kj::_::NullableValue::operator_cast_to_ResolvedDecl_((NullableValue *)local_a8);
  if (pRVar1 != (ResolvedDecl *)0x0) {
    pRVar1 = kj::_::NullableValue<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>::
             operator->((NullableValue<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl> *)
                        local_a8);
    pRVar2 = kj::_::NullableValue<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>::
             operator->((NullableValue<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl> *)
                        local_a8);
    pRVar3 = kj::_::NullableValue<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>::
             operator->((NullableValue<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl> *)
                        local_a8);
    kj::
    refcounted<capnp::compiler::NodeTranslator::BrandScope,capnp::compiler::ErrorReporter&,unsigned_long&,unsigned_int&,capnp::compiler::NodeTranslator::Resolver&>
              ((kj *)&local_130,errorReporter,&pRVar1->id,&pRVar2->genericParamCount,
               pRVar3->resolver);
    kj::Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_>::Maybe(&local_120,&local_130);
    kj::Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_>::operator=
              (&this->parent,&local_120);
    kj::Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_>::~Maybe(&local_120);
    kj::Own<capnp::compiler::NodeTranslator::BrandScope>::~Own(&local_130);
  }
  kj::_::NullableValue<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>::~NullableValue
            ((NullableValue<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl> *)local_a8);
  return;
}

Assistant:

BrandScope(ErrorReporter& errorReporter, uint64_t startingScopeId,
             uint startingScopeParamCount, Resolver& startingScope)
      : errorReporter(errorReporter), parent(nullptr), leafId(startingScopeId),
        leafParamCount(startingScopeParamCount), inherited(true) {
    // Create all lexical parent scopes, all with no brand bindings.
    KJ_IF_MAYBE(p, startingScope.getParent()) {
      parent = kj::refcounted<BrandScope>(
          errorReporter, p->id, p->genericParamCount, *p->resolver);
    }
  }